

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O2

void test_bogus_name(wins *wins_ar,int ar_len)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  Am_Font bogus_font;
  
  Am_Font::Am_Font(&bogus_font,"*-Bogus-Font-*");
  uVar3 = 0;
  uVar2 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x40 != uVar3; uVar3 = uVar3 + 0x40) {
    plVar1 = *(long **)((long)&wins_ar->font_win + uVar3);
    (**(code **)(*plVar1 + 0x170))
              (plVar1,&black,"This is Bogus",0xd,&bogus_font,0x50,0x14,0,&Am_No_Style,0);
    (**(code **)(*plVar1 + 0xa0))(plVar1);
  }
  Am_Font::~Am_Font(&bogus_font);
  return;
}

Assistant:

void
test_bogus_name(wins *wins_ar, int ar_len)
{
  Am_Font bogus_font("*-Bogus-Font-*");
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *font_win = wins_ar[i].font_win;
    font_win->Draw_Text(black, "This is Bogus", 13, bogus_font, 80, 20);
    font_win->Flush_Output();
  }
}